

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int2str.hpp
# Opt level: O0

char * int2str::impl::detail<10000ull>::convert<char*>(number_t x,char *iter)

{
  char *iter_local;
  number_t x_local;
  
  if (x < 10000) {
    x_local = (number_t)detail<1000ull>::convert<char*>(x,iter);
  }
  else {
    x_local = (number_t)convert_step<char*>(x,iter);
  }
  return (char *)x_local;
}

Assistant:

inline static Iter convert(number_t x, Iter iter)
    {
        if (N > x)
            return detail<N / 10u>::convert(x, iter);
        return detail<N>::convert_step(x, iter);
    }